

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Problem_CGBG_FF::TypeIndexToObservationIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Problem_CGBG_FF *this,Index agI,Index typeI)

{
  pointer pvVar1;
  ulong uVar2;
  ulong uVar3;
  allocator_type local_19;
  
  uVar3 = (ulong)agI;
  pvVar1 = (this->_m_houseIndices_obs).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->_m_houseIndices_obs).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  if (uVar3 <= uVar2 && uVar2 - uVar3 != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,
               (long)*(pointer *)
                      ((long)&pvVar1[uVar3].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + 8) -
               *(long *)&pvVar1[uVar3].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data >> 2,&local_19);
    TypeIndexToObservationIndices(this,typeI,__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

vector<Index> Problem_CGBG_FF::TypeIndexToObservationIndices(
        Index agI, Index typeI) const
{
    const vector<Index> & obsHouseIndices = _m_houseIndices_obs.at(agI);
    vector<Index> obsIndices(obsHouseIndices.size());
    TypeIndexToObservationIndices(typeI, obsIndices);
    return obsIndices;
}